

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O2

void EPSG_reset(EPSG *psg)

{
  long lVar1;
  
  psg->base_count = 0;
  for (lVar1 = 0x5b; lVar1 != 0x5e; lVar1 = lVar1 + 1) {
    *(undefined2 *)((long)psg + lVar1 * 2 + -0x76) = 0x1000;
    (psg->reg + lVar1 * 2 + -0x7c)[0] = '\0';
    (psg->reg + lVar1 * 2 + -0x7c)[1] = '\0';
    psg->reg[lVar1 + -0x1b] = '\0';
    psg->reg[lVar1 + -0x25] = '\0';
    (psg->reg + lVar1 * 2 + -0x10)[0] = '\0';
    (psg->reg + lVar1 * 2 + -0x10)[1] = '\0';
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    psg->reg[lVar1] = '\0';
  }
  psg->adr = '\0';
  psg->noise_seed = 0xffff;
  psg->noise_count = '@';
  psg->noise_freq = '\0';
  psg->env_ptr = '\0';
  psg->env_freq = 0;
  psg->env_count = 0;
  psg->env_pause = '\x01';
  return;
}

Assistant:

void
EPSG_reset (EPSG * psg)
{
  int i;

  psg->base_count = 0;

  for (i = 0; i < 3; i++)
  {
    psg->count[i] = 0x1000;
    psg->freq[i] = 0;
    psg->edge[i] = 0;
    psg->volume[i] = 0;
    psg->ch_out[i] = 0;
  }

  //psg->mask = 0;

  for (i = 0; i < 16; i++)
    psg->reg[i] = 0;
  psg->adr = 0;

  psg->noise_seed = 0xffff;
  psg->noise_count = 0x40;
  psg->noise_freq = 0;

  //psg->env_volume = 0;
  psg->env_ptr = 0;
  psg->env_freq = 0;
  psg->env_count = 0;
  psg->env_pause = 1;

  //psg->out = 0;

}